

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_test.cpp
# Opt level: O1

void __thiscall Image_GetSetRGB_Test::TestBody(Image_GetSetRGB_Test *this)

{
  PixelFormat format;
  undefined8 uVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  Allocator alloc;
  float *pfVar4;
  long lVar5;
  int c;
  long lVar6;
  Point2i p;
  char *pcVar7;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  actual;
  float *actual_00;
  size_type *actual_01;
  ColorEncodingHandle *encoding;
  int c_00;
  ulong uVar8;
  int x;
  ulong uVar9;
  long *plVar10;
  long *plVar11;
  undefined1 auVar12 [16];
  Float FVar13;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels_00;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  AssertionResult gtest_ar__1;
  ImageChannelValues rgb;
  AssertionResult gtest_ar_;
  Float qv;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> rgbPixels;
  ImageChannelDesc rgbDesc;
  Image image;
  AssertHelper local_2b0;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2a8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2a0;
  AssertHelper local_298;
  undefined1 local_290 [16];
  undefined1 local_280 [8];
  float local_278 [2];
  undefined1 *local_270;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *local_268;
  undefined1 local_260 [16];
  long *local_250 [2];
  long local_240 [2];
  long *local_230;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_228;
  undefined1 local_220 [8];
  size_type local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210;
  undefined1 **local_200;
  undefined1 **local_1f8;
  undefined1 **local_1f0;
  long local_1e8;
  ulong local_1e0;
  PixelFormat local_1d8;
  Float local_1d4;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_1d0;
  long local_1b0;
  long local_1a8;
  long local_1a0;
  ulong local_198;
  ColorEncodingHandle local_190;
  PixelFormat local_184 [3];
  ImageChannelDesc local_178;
  Image local_148;
  
  GetFloatPixels(&local_1d0,(Point2i)0x2000000007,3);
  local_184[0] = U256;
  local_184[1] = Half;
  local_184[2] = 2;
  local_1f0 = &local_270;
  local_1f8 = &local_270;
  local_200 = &local_270;
  lVar6 = 0;
  do {
    plVar11 = local_240;
    format = *(PixelFormat *)((long)local_184 + lVar6);
    local_290._0_8_ = local_280;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_290,"R","");
    local_270 = local_260;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"G","");
    local_250[0] = plVar11;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_250,"B","");
    local_190.
    super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
    .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
             )(TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
               )pbrt::ColorEncodingHandle::Linear.bits;
    alloc.memoryResource = pstd::pmr::new_delete_resource();
    encoding = &local_190;
    channels.n = 3;
    channels.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_290;
    pbrt::Image::Image(&local_148,format,(Point2i)0x2000000007,channels,encoding,alloc);
    lVar5 = -0x60;
    do {
      if (plVar11 != (long *)plVar11[-2]) {
        operator_delete((long *)plVar11[-2],*plVar11 + 1);
      }
      plVar11 = plVar11 + -4;
      lVar5 = lVar5 + 0x20;
    } while (lVar5 != 0);
    lVar5 = 0;
    uVar8 = 0;
    local_1d8 = format;
    local_1b0 = lVar6;
    do {
      uVar9 = 0;
      local_1e8 = lVar5;
      local_1e0 = uVar8;
      do {
        lVar6 = 0;
        do {
          pbrt::Image::SetChannel
                    (&local_148,(Point2i)(uVar8 << 0x20 | uVar9),(int)lVar6,
                     *(Float *)((long)local_1d0.ptr + lVar6 * 4 + lVar5));
          lVar6 = lVar6 + 1;
        } while (lVar6 != 3);
        uVar9 = uVar9 + 1;
        lVar5 = lVar5 + 0xc;
      } while (uVar9 != 7);
      uVar8 = local_1e0 + 1;
      lVar5 = local_1e8 + 0x54;
    } while (uVar8 != 0x20);
    local_290._0_8_ = local_280;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_290,"R","");
    local_270 = local_260;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"G","");
    plVar11 = local_240;
    local_250[0] = plVar11;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_250,"B","");
    requestedChannels.n = 3;
    requestedChannels.ptr =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_290;
    pbrt::Image::GetChannelDesc(&local_178,&local_148,requestedChannels);
    lVar6 = -0x60;
    plVar10 = plVar11;
    do {
      if (plVar10 != (long *)plVar10[-2]) {
        operator_delete((long *)plVar10[-2],*plVar10 + 1);
      }
      plVar10 = plVar10 + -4;
      lVar6 = lVar6 + 0x20;
    } while (lVar6 != 0);
    local_230 = (long *)CONCAT71(local_230._1_7_,local_178.offset.nStored != 0);
    local_228.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_178.offset.nStored == 0) {
      testing::Message::Message((Message *)&local_2a8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_290,(internal *)&local_230,(AssertionResult *)"bool(rgbDesc)",
                 "false","true",(char *)encoding);
      testing::internal::AssertHelper::AssertHelper
                (&local_2b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                 ,0x98,(char *)local_290._0_8_);
      testing::internal::AssertHelper::operator=(&local_2b0,(Message *)&local_2a8);
      testing::internal::AssertHelper::~AssertHelper(&local_2b0);
      if ((undefined1 *)local_290._0_8_ != local_280) {
        operator_delete((void *)local_290._0_8_,(long)local_280 + 1);
      }
      if (local_2a8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) &&
           (local_2a8.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_2a8.ptr_ + 8))();
        }
        local_2a8.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_228,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_290._0_8_ = local_280;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_290,"R","");
    local_270 = local_260;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"Gxxx","");
    local_250[0] = plVar11;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_250,"B","");
    requestedChannels_00.n = 3;
    requestedChannels_00.ptr =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_290;
    pbrt::Image::GetChannelDesc((ImageChannelDesc *)&local_230,&local_148,requestedChannels_00);
    local_2a8.ptr_._0_1_ = (internal)(local_210._8_8_ == 0);
    local_2a0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_210._8_8_ = 0;
    (**(code **)(*local_230 + 0x18))(local_230,local_228.ptr_,local_210._M_allocated_capacity << 2);
    lVar6 = -0x60;
    do {
      if (plVar11 != (long *)plVar11[-2]) {
        operator_delete((long *)plVar11[-2],*plVar11 + 1);
      }
      plVar11 = plVar11 + -4;
      lVar6 = lVar6 + 0x20;
    } while (lVar6 != 0);
    if (local_2a8.ptr_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_230);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_290,(internal *)&local_2a8,
                 (AssertionResult *)"bool(image.GetChannelDesc({\"R\", \"Gxxx\", \"B\"}))","true",
                 "false",(char *)encoding);
      testing::internal::AssertHelper::AssertHelper
                (&local_2b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                 ,0x99,(char *)local_290._0_8_);
      testing::internal::AssertHelper::operator=(&local_2b0,(Message *)&local_230);
      testing::internal::AssertHelper::~AssertHelper(&local_2b0);
      if ((undefined1 *)local_290._0_8_ != local_280) {
        operator_delete((void *)local_290._0_8_,(long)local_280 + 1);
      }
      if (local_230 != (long *)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) && (local_230 != (long *)0x0)) {
          (**(code **)(*local_230 + 8))();
        }
        local_230 = (long *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_2a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    lVar6 = 0;
    lVar5 = 0;
    do {
      local_198 = lVar5 << 0x20;
      uVar8 = 0;
      local_1e8 = lVar6;
      local_1a8 = lVar5;
      local_1a0 = lVar6;
      do {
        p.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)(local_198 | uVar8);
        pbrt::Image::GetChannels
                  ((ImageChannelValues *)local_290,&local_148,p,(WrapMode2D)0x200000002);
        local_2b0.data_._0_4_ = 4.2039e-45;
        local_2a8.ptr_ = local_268;
        testing::internal::CmpHelperEQ<int,unsigned_long>
                  ((internal *)&local_230,"3","rgb.size()",(int *)&local_2b0,
                   (unsigned_long *)&local_2a8);
        if (local_230._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)&local_2a8);
          pcVar7 = "";
          if (local_228.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar7 = ((local_228.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_2b0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                     ,0x9e,pcVar7);
          testing::internal::AssertHelper::operator=(&local_2b0,(Message *)&local_2a8);
          testing::internal::AssertHelper::~AssertHelper(&local_2b0);
          if (local_2a8.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar3 = testing::internal::IsTrue(true);
            if ((bVar3) &&
               (local_2a8.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_2a8.ptr_ + 8))();
            }
            local_2a8.ptr_ =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_228,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        ;
        pbrt::Image::GetChannels
                  ((ImageChannelValues *)&local_230,&local_148,p,&local_178,(WrapMode2D)0x200000002)
        ;
        pfVar4 = (float *)local_290._8_8_;
        if ((float *)local_290._8_8_ == (float *)0x0) {
          pfVar4 = (float *)local_280;
        }
        actual.ptr_ = local_228.ptr_;
        if (local_228.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          actual.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_220;
        }
        testing::internal::CmpHelperEQ<float,float>
                  ((internal *)&local_2a8,"rgb[0]","rgb2[0]",pfVar4,(float *)actual.ptr_);
        if (local_2a8.ptr_._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)&local_2b0);
          pcVar7 = "";
          if (local_2a0.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar7 = ((local_2a0.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_298,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                     ,0xa1,pcVar7);
          testing::internal::AssertHelper::operator=(&local_298,(Message *)&local_2b0);
          testing::internal::AssertHelper::~AssertHelper(&local_298);
          if (local_2b0.data_ != (AssertHelperData *)0x0) {
            bVar3 = testing::internal::IsTrue(true);
            if ((bVar3) && (local_2b0.data_ != (AssertHelperData *)0x0)) {
              (**(code **)(*(long *)local_2b0.data_ + 8))();
            }
            local_2b0.data_ = (AssertHelperData *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_2a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        ;
        pfVar4 = (float *)(local_290._8_8_ + 4);
        if ((float *)local_290._8_8_ == (float *)0x0) {
          pfVar4 = (float *)(local_280 + 4);
        }
        actual_00 = (float *)((long)&((local_228.ptr_)->_M_dataplus)._M_p + 4);
        if (local_228.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          actual_00 = (float *)(local_220 + 4);
        }
        testing::internal::CmpHelperEQ<float,float>
                  ((internal *)&local_2a8,"rgb[1]","rgb2[1]",pfVar4,actual_00);
        if (local_2a8.ptr_._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)&local_2b0);
          pcVar7 = "";
          if (local_2a0.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar7 = ((local_2a0.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_298,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                     ,0xa2,pcVar7);
          testing::internal::AssertHelper::operator=(&local_298,(Message *)&local_2b0);
          testing::internal::AssertHelper::~AssertHelper(&local_298);
          if (local_2b0.data_ != (AssertHelperData *)0x0) {
            bVar3 = testing::internal::IsTrue(true);
            if ((bVar3) && (local_2b0.data_ != (AssertHelperData *)0x0)) {
              (**(code **)(*(long *)local_2b0.data_ + 8))();
            }
            local_2b0.data_ = (AssertHelperData *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_2a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        ;
        pfVar4 = (float *)(local_290._8_8_ + 8);
        if ((float *)local_290._8_8_ == (float *)0x0) {
          pfVar4 = local_278;
        }
        actual_01 = &(local_228.ptr_)->_M_string_length;
        if (local_228.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          actual_01 = &local_218;
        }
        testing::internal::CmpHelperEQ<float,float>
                  ((internal *)&local_2a8,"rgb[2]","rgb2[2]",pfVar4,(float *)actual_01);
        if (local_2a8.ptr_._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)&local_2b0);
          pcVar7 = "";
          if (local_2a0.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar7 = ((local_2a0.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_298,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                     ,0xa3,pcVar7);
          testing::internal::AssertHelper::operator=(&local_298,(Message *)&local_2b0);
          testing::internal::AssertHelper::~AssertHelper(&local_298);
          if (local_2b0.data_ != (AssertHelperData *)0x0) {
            bVar3 = testing::internal::IsTrue(true);
            if ((bVar3) && (local_2b0.data_ != (AssertHelperData *)0x0)) {
              (**(code **)(*(long *)local_2b0.data_ + 8))();
            }
            local_2b0.data_ = (AssertHelperData *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_2a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        ;
        lVar5 = 0;
        c_00 = 0;
        lVar6 = local_1e8;
        local_1e0 = uVar8;
        do {
          pfVar4 = (float *)local_290._8_8_;
          FVar13 = pbrt::Image::GetChannel(&local_148,p,c_00,(WrapMode2D)0x200000002);
          if (pfVar4 == (float *)0x0) {
            pfVar4 = (float *)local_280;
          }
          local_2b0.data_._0_4_ = FVar13;
          testing::internal::CmpHelperEQ<float,float>
                    ((internal *)&local_2a8,"rgb[c]","image.GetChannel({x, y}, c)",
                     (float *)((long)pfVar4 + lVar5),(float *)&local_2b0);
          if (local_2a8.ptr_._0_1_ == (internal)0x0) {
            testing::Message::Message((Message *)&local_2b0);
            pcVar7 = "";
            if (local_2a0.ptr_ !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar7 = ((local_2a0.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_298,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                       ,0xa6,pcVar7);
            testing::internal::AssertHelper::operator=(&local_298,(Message *)&local_2b0);
            testing::internal::AssertHelper::~AssertHelper(&local_298);
            if (local_2b0.data_ != (AssertHelperData *)0x0) {
              bVar3 = testing::internal::IsTrue(true);
              if ((bVar3) && (local_2b0.data_ != (AssertHelperData *)0x0)) {
                (**(code **)(*(long *)local_2b0.data_ + 8))();
              }
              local_2b0.data_ = (AssertHelperData *)0x0;
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_2a0,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          if (local_1d8 == U256) {
            pfVar4 = (float *)local_290._8_8_;
            if ((float *)local_290._8_8_ == (float *)0x0) {
              pfVar4 = (float *)local_280;
            }
            auVar12 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),
                                 ZEXT416(*(uint *)((long)local_1d0.ptr + lVar6)));
            uVar1 = vcmpss_avx512f(ZEXT416(*(uint *)((long)local_1d0.ptr + lVar6)),
                                   ZEXT816(0) << 0x40,1);
            auVar2._8_4_ = 0x7fffffff;
            auVar2._0_8_ = 0x7fffffff7fffffff;
            auVar2._12_4_ = 0x7fffffff;
            auVar12 = vandps_avx512vl(ZEXT416((uint)(*(float *)((long)pfVar4 + lVar5) -
                                                    (float)((uint)!(bool)((byte)uVar1 & 1) *
                                                           auVar12._0_4_))),auVar2);
            local_2b0.data_._0_4_ = (Float)auVar12._0_4_;
            local_298.data_._0_4_ = 0x3b00c24b;
            testing::internal::CmpHelperLT<float,float>
                      ((internal *)&local_2a8,"std::abs(rgb[c] - Clamp(rgbPixels[offset], 0, 1))",
                       "0.501f / 255.f",(float *)&local_2b0,(float *)&local_298);
            if (local_2a8.ptr_._0_1_ == (internal)0x0) {
              testing::Message::Message((Message *)&local_2b0);
              pcVar7 = "";
              if (local_2a0.ptr_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar7 = ((local_2a0.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_298,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                         ,0xaa,pcVar7);
              testing::internal::AssertHelper::operator=(&local_298,(Message *)&local_2b0);
              testing::internal::AssertHelper::~AssertHelper(&local_298);
              if (local_2b0.data_ != (AssertHelperData *)0x0) {
                bVar3 = testing::internal::IsTrue(true);
                if ((bVar3) && (local_2b0.data_ != (AssertHelperData *)0x0)) {
                  (**(code **)(*(long *)local_2b0.data_ + 8))();
                }
                local_2b0.data_ = (AssertHelperData *)0x0;
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&local_2a0,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          }
          else {
            local_1d4 = modelQuantization(*(Float *)((long)local_1d0.ptr + lVar6),local_1d8);
            pfVar4 = (float *)local_290._8_8_;
            if ((float *)local_290._8_8_ == (float *)0x0) {
              pfVar4 = (float *)local_280;
            }
            testing::internal::CmpHelperEQ<float,float>
                      ((internal *)&local_2a8,"rgb[c]","qv",(float *)((long)pfVar4 + lVar5),
                       &local_1d4);
            if (local_2a8.ptr_._0_1_ == (internal)0x0) {
              testing::Message::Message((Message *)&local_2b0);
              pcVar7 = "";
              if (local_2a0.ptr_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar7 = ((local_2a0.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_298,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                         ,0xad,pcVar7);
              testing::internal::AssertHelper::operator=(&local_298,(Message *)&local_2b0);
              testing::internal::AssertHelper::~AssertHelper(&local_298);
              if (local_2b0.data_ != (AssertHelperData *)0x0) {
                bVar3 = testing::internal::IsTrue(true);
                if ((bVar3) && (local_2b0.data_ != (AssertHelperData *)0x0)) {
                  (**(code **)(*(long *)local_2b0.data_ + 8))();
                }
                local_2b0.data_ = (AssertHelperData *)0x0;
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&local_2a0,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          }
          lVar6 = lVar6 + 4;
          c_00 = c_00 + 1;
          lVar5 = lVar5 + 4;
        } while (lVar5 != 0xc);
        local_210._8_8_ = 0;
        (**(code **)(*local_230 + 0x18))
                  (local_230,local_228.ptr_,local_210._M_allocated_capacity << 2,4);
        local_268 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        (**(code **)(*(long *)local_290._0_8_ + 0x18))
                  (local_290._0_8_,local_290._8_8_,(long)local_270 << 2,4);
        uVar8 = local_1e0 + 1;
        local_1e8 = local_1e8 + 0xc;
      } while (uVar8 != 7);
      lVar5 = local_1a8 + 1;
      lVar6 = local_1a0 + 0x54;
    } while (lVar5 != 0x20);
    local_178.offset.nStored = 0;
    (*(local_178.offset.alloc.memoryResource)->_vptr_memory_resource[3])
              (local_178.offset.alloc.memoryResource,local_178.offset.ptr,
               local_178.offset.nAlloc << 2,4);
    local_148.p32.nStored = 0;
    (*(local_148.p32.alloc.memoryResource)->_vptr_memory_resource[3])
              (local_148.p32.alloc.memoryResource,local_148.p32.ptr,local_148.p32.nAlloc << 2,4);
    lVar6 = local_1b0;
    local_148.p16.nStored = 0;
    (*(local_148.p16.alloc.memoryResource)->_vptr_memory_resource[3])
              (local_148.p16.alloc.memoryResource,local_148.p16.ptr,local_148.p16.nAlloc * 2,2);
    local_148.p8.nStored = 0;
    (*(local_148.p8.alloc.memoryResource)->_vptr_memory_resource[3])
              (local_148.p8.alloc.memoryResource,local_148.p8.ptr,local_148.p8.nAlloc,1);
    pbrt::
    InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~InlinedVector(&local_148.channelNames);
    lVar6 = lVar6 + 4;
  } while (lVar6 != 0xc);
  local_1d0.nStored = 0;
  (*(local_1d0.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_1d0.alloc.memoryResource,local_1d0.ptr,local_1d0.nAlloc << 2,4);
  return;
}

Assistant:

TEST(Image, GetSetRGB) {
    Point2i res(7, 32);
    pstd::vector<float> rgbPixels = GetFloatPixels(res, 3);

    for (auto format : {PixelFormat::U256, PixelFormat::Half, PixelFormat::Float}) {
        Image image(format, res, {"R", "G", "B"}, ColorEncodingHandle::Linear);
        for (int y = 0; y < res[1]; ++y)
            for (int x = 0; x < res[0]; ++x)
                for (int c = 0; c < 3; ++c)
                    image.SetChannel({x, y}, c, rgbPixels[3 * y * res[0] + 3 * x + c]);

        ImageChannelDesc rgbDesc = image.GetChannelDesc({"R", "G", "B"});
        EXPECT_TRUE(bool(rgbDesc));
        EXPECT_FALSE(bool(image.GetChannelDesc({"R", "Gxxx", "B"})));

        for (int y = 0; y < res[1]; ++y)
            for (int x = 0; x < res[0]; ++x) {
                ImageChannelValues rgb = image.GetChannels({x, y});
                EXPECT_EQ(3, rgb.size());

                ImageChannelValues rgb2 = image.GetChannels({x, y}, rgbDesc);
                EXPECT_EQ(rgb[0], rgb2[0]);
                EXPECT_EQ(rgb[1], rgb2[1]);
                EXPECT_EQ(rgb[2], rgb2[2]);

                for (int c = 0; c < 3; ++c) {
                    EXPECT_EQ(rgb[c], image.GetChannel({x, y}, c));
                    int offset = 3 * y * res[0] + 3 * x + c;
                    if (format == PixelFormat::U256)
                        EXPECT_LT(std::abs(rgb[c] - Clamp(rgbPixels[offset], 0, 1)),
                                  0.501f / 255.f);
                    else {
                        Float qv = modelQuantization(rgbPixels[offset], format);
                        EXPECT_EQ(rgb[c], qv);
                    }
                }
            }
    }
}